

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SEQUENCE_OF.c
# Opt level: O0

asn_enc_rval_t *
SEQUENCE_OF_encode_uper
          (asn_TYPE_descriptor_t *td,asn_per_constraints_t *constraints,void *sptr,
          asn_per_outp_t *po)

{
  int iVar1;
  long *in_RCX;
  long lVar2;
  long in_RDX;
  asn_TYPE_descriptor_s *in_RSI;
  asn_enc_rval_t *in_RDI;
  asn_per_outp_t *in_R8;
  bool bVar3;
  asn_enc_rval_t *tmp_error;
  void *memb_ptr;
  ssize_t mayEncode;
  int not_in_root;
  int seq;
  asn_TYPE_member_t *elm;
  asn_enc_rval_t er;
  asn_per_constraint_t *ct;
  asn_anonymous_sequence_ *list;
  char *local_d0;
  char *local_c8;
  size_t in_stack_ffffffffffffff40;
  asn_per_outp_t *in_stack_ffffffffffffff48;
  char *local_b0;
  char *local_a8;
  int in_stack_ffffffffffffff60;
  undefined3 uVar4;
  uint32_t in_stack_ffffffffffffff64;
  asn_per_outp_t *in_stack_ffffffffffffff68;
  char *pcVar5;
  asn_enc_rval_t local_80;
  void *local_68;
  long local_60;
  uint local_58;
  int local_54;
  asn_TYPE_member_s *local_50;
  ssize_t local_48;
  asn_TYPE_descriptor_s *local_40;
  void *local_38;
  asn_per_constraint_s *local_30;
  long *local_28;
  asn_per_outp_t *local_20;
  long *local_18;
  long local_10;
  asn_TYPE_descriptor_s *local_8;
  
  local_50 = in_RSI->elements;
  if (in_RCX == (long *)0x0) {
    in_RDI->encoded = -1;
    in_RDI->failed_type = in_RSI;
    in_RDI->structure_ptr = (void *)0x0;
    if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = in_RSI->name;
    }
    ASN_DEBUG("Failed to encode element %s",pcVar5);
    return in_RDI;
  }
  local_48 = 0;
  local_28 = in_RCX;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  ASN_DEBUG("Encoding %s as SEQUENCE OF (%d)",in_RSI->name,(ulong)*(uint *)(in_RCX + 1));
  if (local_10 == 0) {
    if (local_8->per_constraints == (asn_per_constraints_t *)0x0) {
      local_30 = (asn_per_constraint_s *)0x0;
    }
    else {
      local_30 = &local_8->per_constraints->size;
    }
  }
  else {
    local_30 = (asn_per_constraint_s *)(local_10 + 0x20);
  }
  if (local_30 != (asn_per_constraint_s *)0x0) {
    uVar4 = (undefined3)in_stack_ffffffffffffff64;
    in_stack_ffffffffffffff64 = CONCAT13(1,uVar4);
    if (local_30->lower_bound <= (long)(int)local_28[1]) {
      in_stack_ffffffffffffff64 = CONCAT13(local_30->upper_bound < (long)(int)local_28[1],uVar4);
    }
    local_58 = in_stack_ffffffffffffff64 >> 0x18;
    pcVar5 = "fix";
    if ((local_30->flags & APC_EXTENSIBLE) != APC_UNCONSTRAINED) {
      pcVar5 = "ext";
    }
    ASN_DEBUG("lb %ld ub %ld %s",local_30->lower_bound,local_30->upper_bound,pcVar5);
    if ((local_30->flags & APC_EXTENSIBLE) == APC_UNCONSTRAINED) {
      if ((local_58 != 0) && (-1 < local_30->effective_bits)) {
        in_RDI->encoded = -1;
        in_RDI->failed_type = local_8;
        in_RDI->structure_ptr = local_18;
        if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
          local_b0 = "";
        }
        else {
          local_b0 = local_8->name;
        }
        ASN_DEBUG("Failed to encode element %s",local_b0);
        return in_RDI;
      }
    }
    else {
      iVar1 = per_put_few_bits(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                               in_stack_ffffffffffffff60);
      if (iVar1 != 0) {
        in_RDI->encoded = -1;
        in_RDI->failed_type = local_8;
        in_RDI->structure_ptr = local_18;
        if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
          local_a8 = "";
        }
        else {
          local_a8 = local_8->name;
        }
        ASN_DEBUG("Failed to encode element %s",local_a8);
        return in_RDI;
      }
      if (local_58 != 0) {
        local_30 = (asn_per_constraint_s *)0x0;
      }
    }
  }
  if (((local_30 == (asn_per_constraint_s *)0x0) || (local_30->effective_bits < 0)) ||
     (iVar1 = per_put_few_bits(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                               in_stack_ffffffffffffff60), iVar1 == 0)) {
    local_54 = -1;
    while (local_54 < (int)local_28[1]) {
      if (local_54 < 0) {
        local_54 = 0;
      }
      if ((local_30 == (asn_per_constraint_s *)0x0) || (local_30->effective_bits < 0)) {
        local_60 = uper_put_length(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        if (local_60 < 0) {
          in_RDI->encoded = -1;
          in_RDI->failed_type = local_8;
          in_RDI->structure_ptr = local_18;
          if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = local_8->name;
          }
          ASN_DEBUG("Failed to encode element %s",pcVar5);
          return in_RDI;
        }
      }
      else {
        local_60 = (long)(int)local_28[1];
      }
      while (lVar2 = local_60 + -1, bVar3 = local_60 != 0, local_60 = lVar2, bVar3) {
        local_68 = *(void **)(*local_28 + (long)local_54 * 8);
        if (local_68 == (void *)0x0) {
          in_RDI->encoded = -1;
          in_RDI->failed_type = local_8;
          in_RDI->structure_ptr = local_18;
          if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
            local_c8 = "";
          }
          else {
            local_c8 = local_8->name;
          }
          local_54 = local_54 + 1;
          ASN_DEBUG("Failed to encode element %s",local_c8);
          return in_RDI;
        }
        local_54 = local_54 + 1;
        (*local_50->type->uper_encoder)
                  (&local_80,local_50->type,local_50->per_constraints,local_68,local_20);
        local_48 = local_80.encoded;
        local_40 = local_80.failed_type;
        local_38 = local_80.structure_ptr;
        if (local_80.encoded == -1) {
          in_RDI->encoded = -1;
          in_RDI->failed_type = local_8;
          in_RDI->structure_ptr = local_18;
          if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
            local_d0 = "";
          }
          else {
            local_d0 = local_8->name;
          }
          ASN_DEBUG("Failed to encode element %s",local_d0);
          return in_RDI;
        }
      }
    }
    in_RDI->encoded = local_48;
    in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
    in_RDI->structure_ptr = (void *)0x0;
  }
  else {
    in_RDI->encoded = -1;
    in_RDI->failed_type = local_8;
    in_RDI->structure_ptr = local_18;
    if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = local_8->name;
    }
    ASN_DEBUG("Failed to encode element %s",pcVar5);
  }
  return in_RDI;
}

Assistant:

asn_enc_rval_t
SEQUENCE_OF_encode_uper(asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {
	asn_anonymous_sequence_ *list;
	asn_per_constraint_t *ct;
	asn_enc_rval_t er;
	asn_TYPE_member_t *elm = td->elements;
	int seq;

	if(!sptr) ASN__ENCODE_FAILED;
	list = _A_SEQUENCE_FROM_VOID(sptr);

	er.encoded = 0;

	ASN_DEBUG("Encoding %s as SEQUENCE OF (%d)", td->name, list->count);

	if(constraints) ct = &constraints->size;
	else if(td->per_constraints) ct = &td->per_constraints->size;
	else ct = 0;

	/* If extensible constraint, check if size is in root */
	if(ct) {
		int not_in_root = (list->count < ct->lower_bound
				|| list->count > ct->upper_bound);
		ASN_DEBUG("lb %ld ub %ld %s",
			ct->lower_bound, ct->upper_bound,
			ct->flags & APC_EXTENSIBLE ? "ext" : "fix");
		if(ct->flags & APC_EXTENSIBLE) {
			/* Declare whether size is in extension root */
			if(per_put_few_bits(po, not_in_root, 1))
				ASN__ENCODE_FAILED;
			if(not_in_root) ct = 0;
		} else if(not_in_root && ct->effective_bits >= 0)
			ASN__ENCODE_FAILED;
	}

	if(ct && ct->effective_bits >= 0) {
		/* X.691, #19.5: No length determinant */
		if(per_put_few_bits(po, list->count - ct->lower_bound,
				ct->effective_bits))
			ASN__ENCODE_FAILED;
	}

	for(seq = -1; seq < list->count;) {
		ssize_t mayEncode;
		if(seq < 0) seq = 0;
		if(ct && ct->effective_bits >= 0) {
			mayEncode = list->count;
		} else {
			mayEncode = uper_put_length(po, list->count - seq);
			if(mayEncode < 0) ASN__ENCODE_FAILED;
		}

		while(mayEncode--) {
			void *memb_ptr = list->array[seq++];
			if(!memb_ptr) ASN__ENCODE_FAILED;
			er = elm->type->uper_encoder(elm->type,
				elm->per_constraints, memb_ptr, po);
			if(er.encoded == -1)
				ASN__ENCODE_FAILED;
		}
	}

	ASN__ENCODED_OK(er);
}